

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O2

char * getDynamicModelName(dynModel model)

{
  if (model < (Air4G|Stationary)) {
    return &DAT_00113630 + *(int *)(&DAT_00113630 + (ulong)model * 4);
  }
  return "unknown";
}

Assistant:

extern char* getDynamicModelName(dynModel model) {
    switch (model) {
        case Portable:   return "Portable";
        case Stationary: return "Stationary";
        case Pedestrian: return "Pedestrian";
        case Automotive: return "Automotive";
        case Sea:        return "Sea";
        case Air1G:      return "Air (less than 1G acceleration)";
        case Air2G:      return "Air (less than 2G acceleration)";
        case Air4G:      return "Air (less than 4G acceleration)";
        case Watch:      return "Watch";
        default:         return "unknown";
    }
}